

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeRecordSet.h
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::AttributeRecordSet::AttributeRecordSet
          (AttributeRecordSet *this,AttributeRecordSet *param_1)

{
  KUINT16 KVar1;
  
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__AttributeRecordSet_00219d00;
  (this->m_EntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00217f20;
  KVar1 = (param_1->m_EntityID).super_SimulationIdentifier.m_ui16ApplicationID;
  (this->m_EntityID).super_SimulationIdentifier.m_ui16SiteID =
       (param_1->m_EntityID).super_SimulationIdentifier.m_ui16SiteID;
  (this->m_EntityID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_EntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00217bc0;
  *(undefined2 *)&(this->m_EntityID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(param_1->m_EntityID).super_SimulationIdentifier.field_0xc;
  this->m_ui16NumAttrRecs = param_1->m_ui16NumAttrRecs;
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ::vector(&this->m_vAttrRec,&param_1->m_vAttrRec);
  return;
}

Assistant:

class KDIS_EXPORT AttributeRecordSet : public DataTypeBase
{
protected:

    EntityIdentifier m_EntityID;

    KUINT16 m_ui16NumAttrRecs;

    std::vector<StdVarPtr> m_vAttrRec;

public:

    static const KUINT16 ATTRIBUTE_RECORD_SET_SIZE = 8; // Min size

    AttributeRecordSet();

    AttributeRecordSet(KDataStream &stream) noexcept(false);

    AttributeRecordSet( const EntityIdentifier & EI );
    
    virtual ~AttributeRecordSet();

    //************************************
    // FullName:    KDIS::DATA_TYPE::AttributeRecordSet::SetEntityIdentifier
    //              KDIS::DATA_TYPE::AttributeRecordSet::GetEntityIdentifier
    // Description: The entity or object to which all Attribute records in this set apply.
    // Parameter:   const EntityIdentifier & EI
    //************************************
    void SetEntityIdentifier( const EntityIdentifier & EI );
    const EntityIdentifier & GetEntityIdentifier() const;
    EntityIdentifier & GetEntityIdentifier();

    //************************************
    // FullName:    KDIS::DATA_TYPE::AttributeRecordSet::GetNumberOfAttributeRecords
    // Description: The number of Attribute Records contained within this set.
    //************************************
    KUINT16 GetNumberOfAttributeRecords() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::AttributeRecordSet::AddAttributeRecord
    //              KDIS::DATA_TYPE::AttributeRecordSet::SetAttributeRecords
    //              KDIS::DATA_TYPE::AttributeRecordSet::GetAttributeRecords
    //              KDIS::DATA_TYPE::AttributeRecordSet::ClearAttributeRecords
    // Description: Add/Set the Attribute Record/s.
    //              Adding will update the Number of Attribute Records Params field.
    // Parameter:   StdVarPtr AR, const vector<StdVarPtr> & AR
    //************************************
    void AddAttributeRecord( StdVarPtr AR );
    void SetAttributeRecords( const std::vector<StdVarPtr> & AR );
    const std::vector<StdVarPtr> & GetAttributeRecords() const;
    void ClearAttributeRecords();

    //************************************
    // FullName:    KDIS::DATA_TYPE::AttributeRecordSet::GetRecordLength
    // Description: Returns the total length of the set in octets.
    //              Note: This field is not part of the data type, this is just a helper function.
    //************************************
    KUINT16 GetRecordLength() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::AttributeRecordSet::GetAsString
    // Description: Returns a string representation.
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::AttributeRecordSet::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::AttributeRecordSet::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const AttributeRecordSet & Value ) const;
    KBOOL operator != ( const AttributeRecordSet & Value ) const;
}